

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_horizontal_6_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 (*pauVar22) [16];
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  ushort uVar23;
  short sVar24;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  short sVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ushort uVar38;
  ulong uVar35;
  undefined1 auVar39 [16];
  __m128i q1q0_out;
  __m128i p1p0_out;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i pq1_pq2;
  __m128i pq0x2_pq1;
  __m128i workp_c;
  __m128i workp_b;
  __m128i workp_a;
  __m128i one;
  __m128i t80;
  __m128i four;
  __m128i zero;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i abs_p1p0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i pq [3];
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i filter1filt;
  __m128i filter2filt;
  __m128i filter2filter1;
  __m128i filt;
  __m128i work;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i t3t4;
  __m128i pmin;
  __m128i pmax;
  __m128i one_1;
  __m128i zero_1;
  undefined4 in_stack_ffffffffffffefd0;
  undefined2 uVar40;
  undefined2 uVar41;
  __m128i *palVar42;
  __m128i *blt;
  __m128i *lt;
  undefined1 (*pauVar43) [16];
  __m128i *pq_00;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  __m128i *local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  __m128i *local_f58;
  undefined8 uStack_f50;
  int local_f24;
  undefined8 *local_f20;
  __m128i *local_f18;
  undefined8 uStack_f10;
  undefined8 *local_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 *local_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 *local_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 *local_e80;
  __m128i *local_e78;
  undefined8 uStack_e70;
  undefined8 *local_e60;
  undefined8 local_d88;
  undefined8 uStack_d80;
  longlong local_d78;
  longlong lStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  ushort local_d38;
  ushort uStack_d36;
  ushort uStack_d34;
  ushort uStack_d32;
  ushort uStack_d30;
  ushort uStack_d2e;
  ushort uStack_d2c;
  ushort uStack_d2a;
  undefined8 local_d08;
  undefined8 uStack_d00;
  longlong local_cf8 [2];
  undefined1 local_ce8 [16];
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  __m128i *local_cb8;
  __m128i *palStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  ulong local_c98;
  undefined8 uStack_c90;
  uint uStack_c8c;
  ulong local_c88;
  longlong local_c78 [2];
  longlong local_c68 [2];
  longlong local_c58 [2];
  uint local_c44;
  undefined1 (*local_c28) [16];
  undefined1 (*local_c20) [16];
  __m128i **local_c18;
  undefined8 *local_c10;
  undefined8 *local_c08;
  undefined8 *local_c00;
  undefined8 *local_bf8;
  __m128i **local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  __m128i *in_stack_fffffffffffff480;
  __m128i *t;
  __m128i *hev_00;
  __m128i *mask_00;
  undefined8 local_b08;
  undefined1 local_af8 [16];
  undefined8 local_ae8;
  uint uStack_adc;
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined8 local_a98;
  undefined8 uStack_a90;
  short local_8e8;
  short sStack_8e6;
  short sStack_8e4;
  short sStack_8e2;
  short local_8d8;
  short sStack_8d6;
  short sStack_8d4;
  short sStack_8d2;
  short sStack_8d0;
  short sStack_8ce;
  short sStack_8cc;
  short sStack_8ca;
  short local_8c8;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short local_878;
  short sStack_876;
  short sStack_874;
  short sStack_872;
  short local_808;
  short sStack_806;
  short sStack_804;
  short sStack_802;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  short local_768;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_760;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  undefined4 uStack_660;
  undefined4 uStack_650;
  uint local_628;
  uint uStack_624;
  uint uStack_620;
  uint uStack_61c;
  uint local_618;
  uint uStack_614;
  uint uStack_610;
  uint uStack_60c;
  ulong local_548;
  ulong uStack_540;
  ulong local_538;
  ulong uStack_530;
  short local_4a8;
  short sStack_4a6;
  short sStack_4a4;
  short sStack_4a2;
  short sStack_4a0;
  short sStack_49e;
  short sStack_49c;
  short sStack_49a;
  short local_498;
  short sStack_496;
  short sStack_494;
  short sStack_492;
  short sStack_490;
  short sStack_48e;
  short sStack_48c;
  short sStack_48a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1d8;
  short sStack_1d6;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  sVar29 = local_ae8._6_2_;
  sVar24 = local_ae8._4_2_;
  local_e60 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) * -2);
  local_f58 = (__m128i *)*local_e60;
  uStack_e70 = 0;
  uStack_f50 = 0;
  local_e80 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * -2);
  local_f68 = *local_e80;
  uStack_e90 = 0;
  uStack_f60 = 0;
  local_ea0 = (undefined8 *)((long)in_RDI + (long)in_ESI * -2);
  local_f78 = *local_ea0;
  uStack_eb0 = 0;
  uStack_f70 = 0;
  local_f88 = *in_RDI;
  uStack_ed0 = 0;
  uStack_f80 = 0;
  local_ee0 = (undefined8 *)((long)in_RDI + (long)in_ESI * 2);
  local_f98 = *local_ee0;
  uStack_ef0 = 0;
  uStack_f90 = 0;
  local_f00 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * 2);
  local_fa8 = (__m128i *)*local_f00;
  uStack_f10 = 0;
  uStack_fa0 = 0;
  local_bf0 = &local_f58;
  local_bf8 = &local_f68;
  local_c00 = &local_f78;
  local_c08 = &local_f88;
  local_c10 = &local_f98;
  local_c18 = &local_fa8;
  local_c20 = &local_fb8;
  local_c28 = &local_fc8;
  hev_00 = (__m128i *)0x0;
  local_be8 = 0;
  uStack_be0 = 0;
  local_d58 = 0;
  uStack_d50 = 0;
  uVar40 = 4;
  local_d68 = 0x4000400040004;
  uStack_d60 = 0x4000400040004;
  uVar41 = 1;
  local_d88 = 0x1000100010001;
  uStack_d80 = 0x1000100010001;
  palVar42 = &local_c78;
  blt = &local_c58;
  lt = &local_c68;
  local_f24 = in_ESI;
  local_f20 = in_RDI;
  local_f18 = local_fa8;
  local_ef8 = local_f98;
  local_ed8 = local_f88;
  local_eb8 = local_f78;
  local_e98 = local_f68;
  local_e78 = local_f58;
  local_cd8 = local_f78;
  uStack_cd0 = local_f88;
  local_cc8 = local_f68;
  uStack_cc0 = local_f98;
  local_cb8 = local_f58;
  palStack_cb0 = local_fa8;
  local_c44 = in_R9D;
  t = local_fa8;
  mask_00 = local_f58;
  get_limit(in_RDX,in_RCX,in_R8,in_R9D,blt,lt,palVar42,(__m128i *)&local_d78);
  pauVar43 = &local_ce8;
  pq_00 = &local_cf8;
  highbd_hev_filter_mask_x_sse2
            (pq_00,(int)((ulong)pauVar43 >> 0x20),lt,blt,palVar42,
             (__m128i *)CONCAT26(uVar41,CONCAT24(uVar40,in_stack_ffffffffffffefd0)),
             in_stack_fffffffffffff480,t,hev_00,mask_00);
  pauVar22 = local_c20;
  auVar25._8_8_ = 0x1000100010001;
  auVar25._0_8_ = 0x1000100010001;
  auVar39 = psllw(auVar25,ZEXT416(local_c44));
  auVar10._8_8_ = 0x1000100010001;
  auVar10._0_8_ = 0x1000100010001;
  auVar39 = psubsw(auVar39,auVar10);
  auVar16._8_8_ = lStack_d70;
  auVar16._0_8_ = local_d78;
  auVar39 = psubsw(auVar39,auVar16);
  auVar17._8_8_ = lStack_d70;
  auVar17._0_8_ = local_d78;
  psubsw(ZEXT816(0),auVar17);
  auVar18._8_8_ = lStack_d70;
  auVar18._0_8_ = local_d78;
  auVar25 = psubsw(*pauVar43,auVar18);
  auVar19._8_8_ = lStack_d70;
  auVar19._0_8_ = local_d78;
  auVar26 = psubsw((undefined1  [16])*pq_00,auVar19);
  local_ad8 = psubsw(auVar25,auVar26);
  local_98 = local_ad8._0_2_;
  sStack_96 = local_ad8._2_2_;
  sStack_94 = local_ad8._4_2_;
  sStack_92 = local_ad8._6_2_;
  sStack_90 = local_ad8._8_2_;
  sStack_8e = local_ad8._10_2_;
  sStack_8c = local_ad8._12_2_;
  sStack_8a = local_ad8._14_2_;
  local_a8 = auVar39._0_2_;
  sStack_a6 = auVar39._2_2_;
  sStack_a4 = auVar39._4_2_;
  sStack_a2 = auVar39._6_2_;
  sStack_a0 = auVar39._8_2_;
  sStack_9e = auVar39._10_2_;
  sStack_9c = auVar39._12_2_;
  sStack_9a = auVar39._14_2_;
  local_ad8._0_2_ =
       (ushort)(local_a8 < local_98) * local_a8 | (ushort)(local_a8 >= local_98) * local_98;
  local_ad8._2_2_ =
       (ushort)(sStack_a6 < sStack_96) * sStack_a6 | (ushort)(sStack_a6 >= sStack_96) * sStack_96;
  local_ad8._4_2_ =
       (ushort)(sStack_a4 < sStack_94) * sStack_a4 | (ushort)(sStack_a4 >= sStack_94) * sStack_94;
  local_ad8._6_2_ =
       (ushort)(sStack_a2 < sStack_92) * sStack_a2 | (ushort)(sStack_a2 >= sStack_92) * sStack_92;
  local_ad8._8_2_ =
       (ushort)(sStack_a0 < sStack_90) * sStack_a0 | (ushort)(sStack_a0 >= sStack_90) * sStack_90;
  local_ad8._10_2_ =
       (ushort)(sStack_9e < sStack_8e) * sStack_9e | (ushort)(sStack_9e >= sStack_8e) * sStack_8e;
  local_ad8._12_2_ =
       (ushort)(sStack_9c < sStack_8c) * sStack_9c | (ushort)(sStack_9c >= sStack_8c) * sStack_8c;
  local_ad8._14_2_ =
       (ushort)(sStack_9a < sStack_8a) * sStack_9a | (ushort)(sStack_9a >= sStack_8a) * sStack_8a;
  local_198 = local_ad8._0_2_;
  sStack_196 = local_ad8._2_2_;
  sStack_194 = local_ad8._4_2_;
  sStack_192 = local_ad8._6_2_;
  sStack_190 = local_ad8._8_2_;
  sStack_18e = local_ad8._10_2_;
  sStack_18c = local_ad8._12_2_;
  sStack_18a = local_ad8._14_2_;
  local_1a8 = (short)local_a98;
  sStack_1a6 = (short)((ulong)local_a98 >> 0x10);
  sStack_1a4 = (short)((ulong)local_a98 >> 0x20);
  sStack_1a2 = (short)((ulong)local_a98 >> 0x30);
  sStack_1a0 = (short)uStack_a90;
  sStack_19e = (short)((ulong)uStack_a90 >> 0x10);
  sStack_19c = (short)((ulong)uStack_a90 >> 0x20);
  sStack_19a = (short)((ulong)uStack_a90 >> 0x30);
  local_ad8._0_2_ =
       (ushort)(local_198 < local_1a8) * local_1a8 | (ushort)(local_198 >= local_1a8) * local_198;
  local_ad8._2_2_ =
       (ushort)(sStack_196 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_196 >= sStack_1a6) * sStack_196;
  local_ad8._4_2_ =
       (ushort)(sStack_194 < sStack_1a4) * sStack_1a4 |
       (ushort)(sStack_194 >= sStack_1a4) * sStack_194;
  local_ad8._6_2_ =
       (ushort)(sStack_192 < sStack_1a2) * sStack_1a2 |
       (ushort)(sStack_192 >= sStack_1a2) * sStack_192;
  local_ad8._8_2_ =
       (ushort)(sStack_190 < sStack_1a0) * sStack_1a0 |
       (ushort)(sStack_190 >= sStack_1a0) * sStack_190;
  local_ad8._10_2_ =
       (ushort)(sStack_18e < sStack_19e) * sStack_19e |
       (ushort)(sStack_18e >= sStack_19e) * sStack_18e;
  local_ad8._12_2_ =
       (ushort)(sStack_18c < sStack_19c) * sStack_19c |
       (ushort)(sStack_18c >= sStack_19c) * sStack_18c;
  local_ad8._14_2_ =
       (ushort)(sStack_18a < sStack_19a) * sStack_19a |
       (ushort)(sStack_18a >= sStack_19a) * sStack_18a;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_ad8._8_8_ & local_c98;
  auVar39 = psubsw(auVar9,local_ad8);
  auVar39 = psubsw(auVar39,local_ad8);
  auVar39 = psubsw(auVar39,local_ad8);
  local_ae8 = auVar39._0_8_;
  local_78 = auVar39._0_2_;
  sStack_76 = auVar39._2_2_;
  sStack_74 = auVar39._4_2_;
  sStack_72 = auVar39._6_2_;
  local_ae8._0_2_ =
       (ushort)(local_a8 < local_78) * local_a8 | (ushort)(local_a8 >= local_78) * local_78;
  local_ae8._2_2_ =
       (ushort)(sStack_a6 < sStack_76) * sStack_a6 | (ushort)(sStack_a6 >= sStack_76) * sStack_76;
  local_ae8._4_2_ =
       (ushort)(sStack_a4 < sStack_74) * sStack_a4 | (ushort)(sStack_a4 >= sStack_74) * sStack_74;
  local_ae8._6_2_ =
       (ushort)(sStack_a2 < sStack_72) * sStack_a2 | (ushort)(sStack_a2 >= sStack_72) * sStack_72;
  local_1d8 = (short)local_ae8;
  sStack_1d6 = (short)(local_ae8 >> 0x10);
  local_ae8._0_2_ =
       (ushort)(local_1d8 < local_1a8) * local_1a8 | (ushort)(local_1d8 >= local_1a8) * local_1d8;
  local_ae8._2_2_ =
       (ushort)(sStack_1d6 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_1d6 >= sStack_1a6) * sStack_1d6;
  local_ae8._4_2_ =
       (ushort)(sVar24 < sStack_1a4) * sStack_1a4 | (ushort)(sVar24 >= sStack_1a4) * sVar24;
  local_ae8._6_2_ =
       (ushort)(sVar29 < sStack_1a2) * sStack_1a2 | (ushort)(sVar29 >= sStack_1a2) * sVar29;
  auVar15._8_8_ = local_ae8 & local_c88;
  auVar15._0_8_ = local_ae8 & local_c88;
  auVar14._8_8_ = 0x3000300030003;
  auVar14._0_8_ = 0x4000400040004;
  local_af8 = paddsw(auVar15,auVar14);
  local_58 = local_af8._0_2_;
  sStack_56 = local_af8._2_2_;
  sStack_54 = local_af8._4_2_;
  sStack_52 = local_af8._6_2_;
  sStack_50 = local_af8._8_2_;
  sStack_4e = local_af8._10_2_;
  sStack_4c = local_af8._12_2_;
  sStack_4a = local_af8._14_2_;
  local_af8._0_2_ =
       (ushort)(local_a8 < local_58) * local_a8 | (ushort)(local_a8 >= local_58) * local_58;
  local_af8._2_2_ =
       (ushort)(sStack_a6 < sStack_56) * sStack_a6 | (ushort)(sStack_a6 >= sStack_56) * sStack_56;
  local_af8._4_2_ =
       (ushort)(sStack_a4 < sStack_54) * sStack_a4 | (ushort)(sStack_a4 >= sStack_54) * sStack_54;
  local_af8._6_2_ =
       (ushort)(sStack_a2 < sStack_52) * sStack_a2 | (ushort)(sStack_a2 >= sStack_52) * sStack_52;
  local_af8._8_2_ =
       (ushort)(sStack_a0 < sStack_50) * sStack_a0 | (ushort)(sStack_a0 >= sStack_50) * sStack_50;
  local_af8._10_2_ =
       (ushort)(sStack_9e < sStack_4e) * sStack_9e | (ushort)(sStack_9e >= sStack_4e) * sStack_4e;
  local_af8._12_2_ =
       (ushort)(sStack_9c < sStack_4c) * sStack_9c | (ushort)(sStack_9c >= sStack_4c) * sStack_4c;
  local_af8._14_2_ =
       (ushort)(sStack_9a < sStack_4a) * sStack_9a | (ushort)(sStack_9a >= sStack_4a) * sStack_4a;
  local_218 = local_af8._0_2_;
  sStack_216 = local_af8._2_2_;
  sStack_214 = local_af8._4_2_;
  sStack_212 = local_af8._6_2_;
  sStack_210 = local_af8._8_2_;
  sStack_20e = local_af8._10_2_;
  sStack_20c = local_af8._12_2_;
  sStack_20a = local_af8._14_2_;
  local_af8._0_2_ =
       (ushort)(local_218 < local_1a8) * local_1a8 | (ushort)(local_218 >= local_1a8) * local_218;
  local_af8._2_2_ =
       (ushort)(sStack_216 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_216 >= sStack_1a6) * sStack_216;
  local_af8._4_2_ =
       (ushort)(sStack_214 < sStack_1a4) * sStack_1a4 |
       (ushort)(sStack_214 >= sStack_1a4) * sStack_214;
  local_af8._6_2_ =
       (ushort)(sStack_212 < sStack_1a2) * sStack_1a2 |
       (ushort)(sStack_212 >= sStack_1a2) * sStack_212;
  local_af8._8_2_ =
       (ushort)(sStack_210 < sStack_1a0) * sStack_1a0 |
       (ushort)(sStack_210 >= sStack_1a0) * sStack_210;
  local_af8._10_2_ =
       (ushort)(sStack_20e < sStack_19e) * sStack_19e |
       (ushort)(sStack_20e >= sStack_19e) * sStack_20e;
  local_af8._12_2_ =
       (ushort)(sStack_20c < sStack_19c) * sStack_19c |
       (ushort)(sStack_20c >= sStack_19c) * sStack_20c;
  local_af8._14_2_ =
       (ushort)(sStack_20a < sStack_19a) * sStack_19a |
       (ushort)(sStack_20a >= sStack_19a) * sStack_20a;
  auVar39 = psraw(local_af8,ZEXT416(3));
  local_af8._0_8_ = auVar39._0_8_;
  auVar13._8_8_ = local_af8._0_8_;
  auVar13._0_8_ = local_af8._0_8_;
  auVar12._8_8_ = 0x1000100010001;
  auVar12._0_8_ = 0x1000100010001;
  auVar27 = paddsw(auVar13,auVar12);
  auVar27 = psraw(auVar27,ZEXT416(1));
  local_ae8 = auVar27._0_8_;
  uStack_adc = ~uStack_c8c & auVar27._12_4_;
  local_af8._12_4_ = auVar39._12_4_;
  local_af8._4_4_ = uStack_adc;
  local_af8._0_4_ = uStack_660;
  auVar8._8_8_ = ~local_c98 & local_ae8;
  auVar8._0_8_ = local_af8._0_8_;
  local_ac8 = psubsw(auVar26,auVar8);
  auVar11._12_4_ = local_af8._12_4_;
  auVar11._8_4_ = uStack_650;
  auVar11._0_8_ = local_b08;
  local_ab8 = paddsw(auVar25,auVar11);
  local_38 = local_ac8._0_2_;
  sStack_36 = local_ac8._2_2_;
  sStack_34 = local_ac8._4_2_;
  sStack_32 = local_ac8._6_2_;
  sStack_30 = local_ac8._8_2_;
  sStack_2e = local_ac8._10_2_;
  sStack_2c = local_ac8._12_2_;
  sStack_2a = local_ac8._14_2_;
  local_ac8._0_2_ =
       (ushort)(local_a8 < local_38) * local_a8 | (ushort)(local_a8 >= local_38) * local_38;
  local_ac8._2_2_ =
       (ushort)(sStack_a6 < sStack_36) * sStack_a6 | (ushort)(sStack_a6 >= sStack_36) * sStack_36;
  local_ac8._4_2_ =
       (ushort)(sStack_a4 < sStack_34) * sStack_a4 | (ushort)(sStack_a4 >= sStack_34) * sStack_34;
  local_ac8._6_2_ =
       (ushort)(sStack_a2 < sStack_32) * sStack_a2 | (ushort)(sStack_a2 >= sStack_32) * sStack_32;
  local_ac8._8_2_ =
       (ushort)(sStack_a0 < sStack_30) * sStack_a0 | (ushort)(sStack_a0 >= sStack_30) * sStack_30;
  local_ac8._10_2_ =
       (ushort)(sStack_9e < sStack_2e) * sStack_9e | (ushort)(sStack_9e >= sStack_2e) * sStack_2e;
  local_ac8._12_2_ =
       (ushort)(sStack_9c < sStack_2c) * sStack_9c | (ushort)(sStack_9c >= sStack_2c) * sStack_2c;
  local_ac8._14_2_ =
       (ushort)(sStack_9a < sStack_2a) * sStack_9a | (ushort)(sStack_9a >= sStack_2a) * sStack_2a;
  local_258 = local_ac8._0_2_;
  sStack_256 = local_ac8._2_2_;
  sStack_254 = local_ac8._4_2_;
  sStack_252 = local_ac8._6_2_;
  sStack_250 = local_ac8._8_2_;
  sStack_24e = local_ac8._10_2_;
  sStack_24c = local_ac8._12_2_;
  sStack_24a = local_ac8._14_2_;
  local_ac8._0_2_ =
       (ushort)(local_258 < local_1a8) * local_1a8 | (ushort)(local_258 >= local_1a8) * local_258;
  local_ac8._2_2_ =
       (ushort)(sStack_256 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_256 >= sStack_1a6) * sStack_256;
  local_ac8._4_2_ =
       (ushort)(sStack_254 < sStack_1a4) * sStack_1a4 |
       (ushort)(sStack_254 >= sStack_1a4) * sStack_254;
  local_ac8._6_2_ =
       (ushort)(sStack_252 < sStack_1a2) * sStack_1a2 |
       (ushort)(sStack_252 >= sStack_1a2) * sStack_252;
  local_ac8._8_2_ =
       (ushort)(sStack_250 < sStack_1a0) * sStack_1a0 |
       (ushort)(sStack_250 >= sStack_1a0) * sStack_250;
  local_ac8._10_2_ =
       (ushort)(sStack_24e < sStack_19e) * sStack_19e |
       (ushort)(sStack_24e >= sStack_19e) * sStack_24e;
  local_ac8._12_2_ =
       (ushort)(sStack_24c < sStack_19c) * sStack_19c |
       (ushort)(sStack_24c >= sStack_19c) * sStack_24c;
  local_ac8._14_2_ =
       (ushort)(sStack_24a < sStack_19a) * sStack_19a |
       (ushort)(sStack_24a >= sStack_19a) * sStack_24a;
  local_18 = local_ab8._0_2_;
  sStack_16 = local_ab8._2_2_;
  sStack_14 = local_ab8._4_2_;
  sStack_12 = local_ab8._6_2_;
  sStack_10 = local_ab8._8_2_;
  sStack_e = local_ab8._10_2_;
  sStack_c = local_ab8._12_2_;
  sStack_a = local_ab8._14_2_;
  local_ab8._0_2_ =
       (ushort)(local_a8 < local_18) * local_a8 | (ushort)(local_a8 >= local_18) * local_18;
  local_ab8._2_2_ =
       (ushort)(sStack_a6 < sStack_16) * sStack_a6 | (ushort)(sStack_a6 >= sStack_16) * sStack_16;
  local_ab8._4_2_ =
       (ushort)(sStack_a4 < sStack_14) * sStack_a4 | (ushort)(sStack_a4 >= sStack_14) * sStack_14;
  local_ab8._6_2_ =
       (ushort)(sStack_a2 < sStack_12) * sStack_a2 | (ushort)(sStack_a2 >= sStack_12) * sStack_12;
  local_ab8._8_2_ =
       (ushort)(sStack_a0 < sStack_10) * sStack_a0 | (ushort)(sStack_a0 >= sStack_10) * sStack_10;
  local_ab8._10_2_ =
       (ushort)(sStack_9e < sStack_e) * sStack_9e | (ushort)(sStack_9e >= sStack_e) * sStack_e;
  local_ab8._12_2_ =
       (ushort)(sStack_9c < sStack_c) * sStack_9c | (ushort)(sStack_9c >= sStack_c) * sStack_c;
  local_ab8._14_2_ =
       (ushort)(sStack_9a < sStack_a) * sStack_9a | (ushort)(sStack_9a >= sStack_a) * sStack_a;
  local_298 = local_ab8._0_2_;
  sStack_296 = local_ab8._2_2_;
  sStack_294 = local_ab8._4_2_;
  sStack_292 = local_ab8._6_2_;
  sStack_290 = local_ab8._8_2_;
  sStack_28e = local_ab8._10_2_;
  sStack_28c = local_ab8._12_2_;
  sStack_28a = local_ab8._14_2_;
  local_ab8._0_2_ =
       (ushort)(local_298 < local_1a8) * local_1a8 | (ushort)(local_298 >= local_1a8) * local_298;
  local_ab8._2_2_ =
       (ushort)(sStack_296 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_296 >= sStack_1a6) * sStack_296;
  local_ab8._4_2_ =
       (ushort)(sStack_294 < sStack_1a4) * sStack_1a4 |
       (ushort)(sStack_294 >= sStack_1a4) * sStack_294;
  local_ab8._6_2_ =
       (ushort)(sStack_292 < sStack_1a2) * sStack_1a2 |
       (ushort)(sStack_292 >= sStack_1a2) * sStack_292;
  local_ab8._8_2_ =
       (ushort)(sStack_290 < sStack_1a0) * sStack_1a0 |
       (ushort)(sStack_290 >= sStack_1a0) * sStack_290;
  local_ab8._10_2_ =
       (ushort)(sStack_28e < sStack_19e) * sStack_19e |
       (ushort)(sStack_28e >= sStack_19e) * sStack_28e;
  local_ab8._12_2_ =
       (ushort)(sStack_28c < sStack_19c) * sStack_19c |
       (ushort)(sStack_28c >= sStack_19c) * sStack_28c;
  local_ab8._14_2_ =
       (ushort)(sStack_28a < sStack_19a) * sStack_19a |
       (ushort)(sStack_28a >= sStack_19a) * sStack_28a;
  auVar20._8_8_ = lStack_d70;
  auVar20._0_8_ = local_d78;
  auVar39 = paddsw(local_ac8,auVar20);
  *local_c28 = auVar39;
  auVar21._8_8_ = lStack_d70;
  auVar21._0_8_ = local_d78;
  auVar39 = paddsw(local_ab8,auVar21);
  *pauVar22 = auVar39;
  auVar6._8_8_ = palStack_cb0;
  auVar6._0_8_ = local_cb8;
  auVar5._8_8_ = uStack_cd0;
  auVar5._0_8_ = local_cd8;
  auVar25 = psubusw(auVar6,auVar5);
  auVar4._8_8_ = uStack_cd0;
  auVar4._0_8_ = local_cd8;
  auVar27._8_8_ = palStack_cb0;
  auVar27._0_8_ = local_cb8;
  auVar39 = psubusw(auVar4,auVar27);
  local_538 = auVar25._0_8_;
  uStack_530 = auVar25._8_8_;
  local_548 = auVar39._0_8_;
  uStack_540 = auVar39._8_8_;
  local_538 = local_538 | local_548;
  uStack_530 = uStack_530 | uStack_540;
  local_498 = (short)local_538;
  sStack_496 = (short)(local_538 >> 0x10);
  sStack_494 = (short)(local_538 >> 0x20);
  sStack_492 = (short)(local_538 >> 0x30);
  sStack_490 = (short)uStack_530;
  sStack_48e = (short)(uStack_530 >> 0x10);
  sStack_48c = (short)(uStack_530 >> 0x20);
  sStack_48a = (short)(uStack_530 >> 0x30);
  local_4a8 = (short)local_d08;
  sStack_4a6 = (short)((ulong)local_d08 >> 0x10);
  sStack_4a4 = (short)((ulong)local_d08 >> 0x20);
  sStack_4a2 = (short)((ulong)local_d08 >> 0x30);
  sStack_4a0 = (short)uStack_d00;
  sStack_49e = (short)((ulong)uStack_d00 >> 0x10);
  sStack_49c = (short)((ulong)uStack_d00 >> 0x20);
  sStack_49a = (short)((ulong)uStack_d00 >> 0x30);
  uVar23 = (ushort)(local_498 < local_4a8) * local_4a8 |
           (ushort)(local_498 >= local_4a8) * local_498;
  uVar28 = (ushort)(sStack_496 < sStack_4a6) * sStack_4a6 |
           (ushort)(sStack_496 >= sStack_4a6) * sStack_496;
  uVar30 = (ushort)(sStack_494 < sStack_4a4) * sStack_4a4 |
           (ushort)(sStack_494 >= sStack_4a4) * sStack_494;
  uVar32 = (ushort)(sStack_492 < sStack_4a2) * sStack_4a2 |
           (ushort)(sStack_492 >= sStack_4a2) * sStack_492;
  uVar34 = (ushort)(sStack_490 < sStack_4a0) * sStack_4a0 |
           (ushort)(sStack_490 >= sStack_4a0) * sStack_490;
  uVar36 = (ushort)(sStack_48e < sStack_49e) * sStack_49e |
           (ushort)(sStack_48e >= sStack_49e) * sStack_48e;
  uVar37 = (ushort)(sStack_48c < sStack_49c) * sStack_49c |
           (ushort)(sStack_48c >= sStack_49c) * sStack_48c;
  uVar38 = (ushort)(sStack_48a < sStack_49a) * sStack_49a |
           (ushort)(sStack_48a >= sStack_49a) * sStack_48a;
  local_ca8._0_4_ =
       CONCAT22(((short)uVar28 < (short)uVar36) * uVar36 | ((short)uVar28 >= (short)uVar36) * uVar28
                ,((short)uVar23 < (short)uVar34) * uVar34 |
                 ((short)uVar23 >= (short)uVar34) * uVar23);
  local_ca8._0_6_ =
       CONCAT24(((short)uVar30 < (short)uVar37) * uVar37 | ((short)uVar30 >= (short)uVar37) * uVar30
                ,(undefined4)local_ca8);
  local_ca8 = CONCAT26(((short)uVar32 < (short)uVar38) * uVar38 |
                       ((short)uVar32 >= (short)uVar38) * uVar32,(undefined6)local_ca8);
  uStack_ca0._0_2_ = (-1 < (short)uVar34) * uVar34;
  uStack_ca0._2_2_ = (-1 < (short)uVar36) * uVar36;
  uStack_ca0._4_2_ = (-1 < (short)uVar37) * uVar37;
  uStack_ca0._6_2_ = (-1 < (short)uVar38) * uVar38;
  auVar26._8_8_ = uStack_d80;
  auVar26._0_8_ = local_d88;
  auVar39 = psllw(auVar26,ZEXT416(local_c44 - 8));
  auVar7._8_8_ = uStack_ca0;
  auVar7._0_8_ = local_ca8;
  auVar39 = psubusw(auVar7,auVar39);
  local_8c8 = auVar39._0_2_;
  sStack_8c6 = auVar39._2_2_;
  sStack_8c4 = auVar39._4_2_;
  sStack_8c2 = auVar39._6_2_;
  local_8d8 = (short)local_d58;
  sStack_8d6 = (short)((ulong)local_d58 >> 0x10);
  sStack_8d4 = (short)((ulong)local_d58 >> 0x20);
  sStack_8d2 = (short)((ulong)local_d58 >> 0x30);
  sStack_8d0 = (short)uStack_d50;
  sStack_8ce = (short)((ulong)uStack_d50 >> 0x10);
  sStack_8cc = (short)((ulong)uStack_d50 >> 0x20);
  sStack_8ca = (short)((ulong)uStack_d50 >> 0x30);
  local_ca8._0_4_ = CONCAT22(-(ushort)(sStack_8c6 == sStack_8d6),-(ushort)(local_8c8 == local_8d8));
  local_ca8._0_6_ = CONCAT24(-(ushort)(sStack_8c4 == sStack_8d4),(undefined4)local_ca8);
  local_ca8 = CONCAT26(-(ushort)(sStack_8c2 == sStack_8d2),(undefined6)local_ca8);
  local_ca8 = local_ca8 & local_c88;
  local_8e8 = (short)local_ca8;
  sStack_8e6 = (short)(local_ca8 >> 0x10);
  sStack_8e4 = (short)(local_ca8 >> 0x20);
  sStack_8e2 = (short)(local_ca8 >> 0x30);
  uVar23 = -(ushort)(sStack_8e2 == sStack_8ca);
  auVar39._2_2_ = -(ushort)(sStack_8e6 == sStack_8d6);
  auVar39._0_2_ = -(ushort)(local_8e8 == local_8d8);
  auVar39._4_2_ = -(ushort)(sStack_8e4 == sStack_8d4);
  auVar39._6_2_ = -(ushort)(sStack_8e2 == sStack_8d2);
  auVar39._8_2_ = -(ushort)(local_8e8 == sStack_8d0);
  auVar39._10_2_ = -(ushort)(sStack_8e6 == sStack_8ce);
  auVar39._12_2_ = -(ushort)(sStack_8e4 == sStack_8cc);
  auVar39._14_2_ = uVar23;
  if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uVar23 >> 7) & 1) << 0xe | uVar23 & 0x8000) != 0xffff) {
    local_738 = (short)local_cd8;
    sStack_736 = (short)((ulong)local_cd8 >> 0x10);
    sStack_734 = (short)((ulong)local_cd8 >> 0x20);
    sStack_732 = (short)((ulong)local_cd8 >> 0x30);
    sStack_730 = (short)uStack_cd0;
    sStack_72e = (short)((ulong)uStack_cd0 >> 0x10);
    sStack_72c = (short)((ulong)uStack_cd0 >> 0x20);
    sStack_72a = (short)((ulong)uStack_cd0 >> 0x30);
    local_768 = (short)local_cc8;
    sStack_766 = (short)((ulong)local_cc8 >> 0x10);
    sStack_764 = (short)((ulong)local_cc8 >> 0x20);
    sStack_762 = (short)((ulong)local_cc8 >> 0x30);
    sStack_760 = (short)uStack_cc0;
    sStack_75e = (short)((ulong)uStack_cc0 >> 0x10);
    sStack_75c = (short)((ulong)uStack_cc0 >> 0x20);
    sStack_75a = (short)((ulong)uStack_cc0 >> 0x30);
    local_788 = (short)local_cb8;
    sStack_786 = (short)((ulong)local_cb8 >> 0x10);
    sStack_784 = (short)((ulong)local_cb8 >> 0x20);
    sStack_782 = (short)((ulong)local_cb8 >> 0x30);
    sStack_780 = (short)palStack_cb0;
    sStack_77e = (short)((ulong)palStack_cb0 >> 0x10);
    sStack_77c = (short)((ulong)palStack_cb0 >> 0x20);
    sStack_77a = (short)((ulong)palStack_cb0 >> 0x30);
    local_7a8 = (short)local_d68;
    sStack_7a6 = (short)((ulong)local_d68 >> 0x10);
    sStack_7a4 = (short)((ulong)local_d68 >> 0x20);
    sStack_7a2 = (short)((ulong)local_d68 >> 0x30);
    sVar24 = local_738 * 2 + local_768 * 2 + local_7a8 + local_788;
    sVar29 = sStack_736 * 2 + sStack_766 * 2 + sStack_7a6 + sStack_786;
    sVar31 = sStack_734 * 2 + sStack_764 * 2 + sStack_7a4 + sStack_784;
    sVar33 = sStack_732 * 2 + sStack_762 * 2 + sStack_7a2 + sStack_782;
    uVar1 = *local_c08;
    local_808 = (short)uVar1;
    sStack_806 = (short)((ulong)uVar1 >> 0x10);
    sStack_804 = (short)((ulong)uVar1 >> 0x20);
    sStack_802 = (short)((ulong)uVar1 >> 0x30);
    uVar23 = sVar24 + sStack_730 * 2 + sStack_760;
    uVar28 = sVar29 + sStack_72e * 2 + sStack_75e;
    uVar30 = sVar31 + sStack_72c * 2 + sStack_75c;
    uVar32 = sVar33 + sStack_72a * 2 + sStack_75a;
    local_d38 = uVar23 >> 3;
    uStack_d36 = uVar28 >> 3;
    uStack_d34 = uVar30 >> 3;
    uStack_d32 = uVar32 >> 3;
    uStack_d30 = (ushort)(sVar24 + local_788 * 2 + local_808) >> 3;
    uStack_d2e = (ushort)(sVar29 + sStack_786 * 2 + sStack_806) >> 3;
    uStack_d2c = (ushort)(sVar31 + sStack_784 * 2 + sStack_804) >> 3;
    uStack_d2a = (ushort)(sVar33 + sStack_782 * 2 + sStack_802) >> 3;
    uVar23 = ((uVar23 - local_788) - local_768) + sStack_760 + sStack_780;
    uVar28 = ((uVar28 - sStack_786) - sStack_766) + sStack_75e + sStack_77e;
    uVar30 = ((uVar30 - sStack_784) - sStack_764) + sStack_75c + sStack_77c;
    uVar32 = ((uVar32 - sStack_782) - sStack_762) + sStack_75a + sStack_77a;
    palVar42 = *local_c18;
    local_878 = (short)palVar42;
    sStack_876 = (short)((ulong)palVar42 >> 0x10);
    sStack_874 = (short)((ulong)palVar42 >> 0x20);
    sStack_872 = (short)((ulong)palVar42 >> 0x30);
    uVar2 = *(ulong *)(*local_c28 + 8);
    uVar3 = ~local_ca8;
    uVar35 = local_ca8 &
             CONCAT26((ushort)(((uVar32 - sStack_762) - sStack_732) + sStack_872 * 2) >> 3,
                      CONCAT24((ushort)(((uVar30 - sStack_764) - sStack_734) + sStack_874 * 2) >> 3,
                               CONCAT22((ushort)(((uVar28 - sStack_766) - sStack_736) +
                                                sStack_876 * 2) >> 3,
                                        (ushort)(((uVar23 - local_768) - local_738) + local_878 * 2)
                                        >> 3)));
    uStack_ca0 = local_ca8;
    *(ulong *)*local_c28 =
         ~local_ca8 & *(ulong *)*local_c28 |
         local_ca8 & CONCAT26(uVar32 >> 3,CONCAT24(uVar30 >> 3,CONCAT22(uVar28 >> 3,uVar23 >> 3)));
    *(ulong *)(*local_c28 + 8) = uVar3 & uVar2 | uVar35;
    local_618 = (uint)local_ca8;
    uStack_614 = (uint)(local_ca8 >> 0x20);
    uStack_610 = (uint)uStack_ca0;
    uStack_60c = (uint)(uStack_ca0 >> 0x20);
    local_628 = (uint)*(undefined8 *)*local_c20;
    uStack_624 = (uint)((ulong)*(undefined8 *)*local_c20 >> 0x20);
    uStack_620 = (uint)*(undefined8 *)(*local_c20 + 8);
    uStack_61c = (uint)((ulong)*(undefined8 *)(*local_c20 + 8) >> 0x20);
    *(ulong *)*local_c20 =
         CONCAT44((uStack_614 ^ 0xffffffff) & uStack_624,(local_618 ^ 0xffffffff) & local_628) |
         local_ca8 & CONCAT26(uStack_d32,CONCAT24(uStack_d34,CONCAT22(uStack_d36,local_d38)));
    *(ulong *)(*local_c20 + 8) =
         CONCAT44((uStack_60c ^ 0xffffffff) & uStack_61c,(uStack_610 ^ 0xffffffff) & uStack_620) |
         uStack_ca0 & CONCAT26(uStack_d2a,CONCAT24(uStack_d2c,CONCAT22(uStack_d2e,uStack_d30)));
  }
  *(undefined8 *)((long)local_f20 + (long)(local_f24 * 2) * -2) = local_fb8._8_8_;
  *(undefined8 *)((long)local_f20 + (long)local_f24 * -2) = local_fb8._0_8_;
  *local_f20 = local_fc8._0_8_;
  *(undefined8 *)((long)local_f20 + (long)local_f24 * 2) = local_fc8._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_6_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p1p0_out, q1q0_out;

  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s + 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));

  highbd_lpf_internal_6_sse2(&p2, &p1, &p0, &q0, &q1, &q2, &p1p0_out, &q1q0_out,
                             _blimit, _limit, _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0_out, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0_out);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0_out);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0_out, 8));
}